

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

void cf_he_ctx_clear(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  Curl_cfilter *pCVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  
  lVar5 = 0;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    pvVar1 = *(void **)(&cf->sockindex + lVar5 * 2);
    if (pvVar1 != (void *)0x0) {
      if (*(long *)((long)pvVar1 + 0x28) != 0) {
        Curl_conn_cf_discard_chain((Curl_cfilter **)((long)pvVar1 + 0x28),data);
      }
      (*Curl_cfree)(pvVar1);
    }
    *(undefined8 *)(&cf->sockindex + lVar5 * 2) = 0;
    lVar5 = 1;
    bVar3 = false;
  } while (bVar4);
  pCVar2 = cf[1].next;
  if (pCVar2 != (Curl_cfilter *)0x0) {
    if (pCVar2[1].cft != (Curl_cftype *)0x0) {
      Curl_conn_cf_discard_chain((Curl_cfilter **)(pCVar2 + 1),data);
    }
    (*Curl_cfree)(pCVar2);
  }
  cf[1].next = (Curl_cfilter *)0x0;
  return;
}

Assistant:

static void cf_he_ctx_clear(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct cf_he_ctx *ctx = cf->ctx;
  size_t i;

  DEBUGASSERT(ctx);
  DEBUGASSERT(data);
  for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
    baller_free(ctx->baller[i], data);
    ctx->baller[i] = NULL;
  }
  baller_free(ctx->winner, data);
  ctx->winner = NULL;
}